

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::SharedCtor(FileOptions *this,Arena *arena)

{
  Impl_::Impl_((Impl_ *)&this->field_0);
  *(undefined8 *)((long)&(this->field_0)._impl_.features_ + 7) = 0;
  (this->field_0)._impl_.features_ = (FeatureSet *)0x0;
  return;
}

Assistant:

inline void FileOptions::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, features_),
           0,
           offsetof(Impl_, java_string_check_utf8_) -
               offsetof(Impl_, features_) +
               sizeof(Impl_::java_string_check_utf8_));
}